

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char_model_trainer.cc
# Opt level: O0

Trainer * __thiscall sentencepiece::character::Trainer::Train(Trainer *this)

{
  bool bVar1;
  TrainerSpec_ModelType TVar2;
  int32 iVar3;
  StatusBuilder *pSVar4;
  size_type sVar5;
  size_type sVar6;
  flat_hash_map<unsigned_int,_long> *m;
  long *in_RSI;
  double dVar7;
  undefined4 extraout_XMM0_Db;
  float local_7c4;
  float local_6e4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e0;
  reference local_6c0;
  pair<unsigned_int,_long> *it_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::pair<unsigned_int,_long>,_std::allocator<std::pair<unsigned_int,_long>_>_> *__range2_1
  ;
  StatusBuilder local_680;
  float local_4fc;
  reference ppStack_4f8;
  float logsum;
  pair<const_unsigned_int,_long> *it;
  iterator __end2;
  iterator __begin2;
  flat_hash_map<char32,_int64> *__range2;
  uint64 sum;
  StatusBuilder local_4c8;
  int local_344;
  byte local_33d;
  int vocab_size;
  StatusBuilder local_338;
  int local_1b4;
  StatusBuilder local_1b0;
  uint local_30;
  byte local_19;
  Trainer *this_local;
  Status *_status;
  
  local_19 = 0;
  this_local = this;
  (**(code **)(*in_RSI + 0x20))(this);
  bVar1 = util::Status::ok((Status *)this);
  if (!bVar1) {
    local_19 = 1;
  }
  local_30 = (uint)!bVar1;
  if ((local_19 & 1) == 0) {
    sentencepiece::util::Status::~Status((Status *)this);
  }
  if (local_30 == 0) {
    bVar1 = NormalizerSpec::escape_whitespaces((NormalizerSpec *)(in_RSI + 0x38));
    if (bVar1) {
      TVar2 = TrainerSpec::model_type((TrainerSpec *)(in_RSI + 0xe));
      if (TVar2 == TrainerSpec_ModelType_CHAR) {
        local_33d = 0;
        TrainerInterface::LoadSentences(&this->super_TrainerInterface);
        bVar1 = util::Status::ok((Status *)this);
        if (!bVar1) {
          local_33d = 1;
        }
        local_30 = (uint)!bVar1;
        if ((local_33d & 1) == 0) {
          sentencepiece::util::Status::~Status((Status *)this);
        }
        if (local_30 == 0) {
          iVar3 = TrainerSpec::vocab_size((TrainerSpec *)(in_RSI + 0xe));
          sVar5 = std::
                  map<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::ModelProto_SentencePiece_Type>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::ModelProto_SentencePiece_Type>_>_>_>
                  ::size((map<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::ModelProto_SentencePiece_Type>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::ModelProto_SentencePiece_Type>_>_>_>
                          *)(in_RSI + 0x4c));
          local_344 = iVar3 - (int)sVar5;
          if (local_344 < 0) {
            util::StatusBuilder::StatusBuilder(&local_4c8,kInternal);
            pSVar4 = util::StatusBuilder::operator<<
                               (&local_4c8,(char (*) [26])"src/char_model_trainer.cc");
            pSVar4 = util::StatusBuilder::operator<<(pSVar4,(char (*) [2])0x3a86b0);
            sum._4_4_ = 0x21;
            pSVar4 = util::StatusBuilder::operator<<(pSVar4,(int *)((long)&sum + 4));
            pSVar4 = util::StatusBuilder::operator<<(pSVar4,(char (*) [4])") [");
            pSVar4 = util::StatusBuilder::operator<<(pSVar4,(char (*) [20])"(vocab_size) >= (0)");
            util::StatusBuilder::operator<<(pSVar4,(char (*) [3])"] ");
            util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this);
            util::StatusBuilder::~StatusBuilder(&local_4c8);
          }
          else {
            __range2 = (flat_hash_map<char32,_int64> *)0x0;
            __end2 = std::
                     unordered_map<unsigned_int,_long,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_long>_>_>
                     ::begin((unordered_map<unsigned_int,_long,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_long>_>_>
                              *)(in_RSI + 1));
            it = (pair<const_unsigned_int,_long> *)
                 std::
                 unordered_map<unsigned_int,_long,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_long>_>_>
                 ::end((unordered_map<unsigned_int,_long,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_long>_>_>
                        *)(in_RSI + 1));
            while (bVar1 = std::__detail::operator!=
                                     (&__end2.
                                       super__Node_iterator_base<std::pair<const_unsigned_int,_long>,_false>
                                      ,(_Node_iterator_base<std::pair<const_unsigned_int,_long>,_false>
                                        *)&it), bVar1) {
              ppStack_4f8 = std::__detail::
                            _Node_iterator<std::pair<const_unsigned_int,_long>,_false,_false>::
                            operator*(&__end2);
              __range2 = (flat_hash_map<char32,_int64> *)
                         ((long)&(__range2->_M_h)._M_buckets + ppStack_4f8->second);
              std::__detail::_Node_iterator<std::pair<const_unsigned_int,_long>,_false,_false>::
              operator++(&__end2);
            }
            local_7c4 = (float)__range2;
            dVar7 = std::log((double)(ulong)(uint)local_7c4);
            local_4fc = SUB84(dVar7,0);
            bVar1 = std::
                    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
                    ::empty((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
                             *)(in_RSI + 8));
            if (bVar1) {
              Sorted<unsigned_int,long>
                        ((vector<std::pair<unsigned_int,_long>,_std::allocator<std::pair<unsigned_int,_long>_>_>
                          *)&__begin2_1,(sentencepiece *)(in_RSI + 1),m);
              __end2_1 = std::
                         vector<std::pair<unsigned_int,_long>,_std::allocator<std::pair<unsigned_int,_long>_>_>
                         ::begin((vector<std::pair<unsigned_int,_long>,_std::allocator<std::pair<unsigned_int,_long>_>_>
                                  *)&__begin2_1);
              it_1 = (pair<unsigned_int,_long> *)
                     std::
                     vector<std::pair<unsigned_int,_long>,_std::allocator<std::pair<unsigned_int,_long>_>_>
                     ::end((vector<std::pair<unsigned_int,_long>,_std::allocator<std::pair<unsigned_int,_long>_>_>
                            *)&__begin2_1);
              while (bVar1 = __gnu_cxx::operator!=
                                       (&__end2_1,
                                        (__normal_iterator<std::pair<unsigned_int,_long>_*,_std::vector<std::pair<unsigned_int,_long>,_std::allocator<std::pair<unsigned_int,_long>_>_>_>
                                         *)&it_1), bVar1) {
                local_6c0 = __gnu_cxx::
                            __normal_iterator<std::pair<unsigned_int,_long>_*,_std::vector<std::pair<unsigned_int,_long>,_std::allocator<std::pair<unsigned_int,_long>_>_>_>
                            ::operator*(&__end2_1);
                bVar1 = TrainerSpec::use_all_vocab((TrainerSpec *)(in_RSI + 0xe));
                if ((!bVar1) &&
                   (sVar6 = std::
                            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
                            ::size((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
                                    *)(in_RSI + 8)), sVar6 == (long)local_344)) break;
                sentencepiece::string_util::UnicodeCharToUTF8_abi_cxx11_((uint)&local_6e0);
                dVar7 = std::log((double)CONCAT44(extraout_XMM0_Db,(float)local_6c0->second));
                local_6e4 = SUB84(dVar7,0) - local_4fc;
                std::
                vector<std::pair<std::__cxx11::string,float>,std::allocator<std::pair<std::__cxx11::string,float>>>
                ::emplace_back<std::__cxx11::string,float>
                          ((vector<std::pair<std::__cxx11::string,float>,std::allocator<std::pair<std::__cxx11::string,float>>>
                            *)(in_RSI + 8),&local_6e0,&local_6e4);
                std::__cxx11::string::~string((string *)&local_6e0);
                __gnu_cxx::
                __normal_iterator<std::pair<unsigned_int,_long>_*,_std::vector<std::pair<unsigned_int,_long>,_std::allocator<std::pair<unsigned_int,_long>_>_>_>
                ::operator++(&__end2_1);
              }
              local_30 = 8;
              std::
              vector<std::pair<unsigned_int,_long>,_std::allocator<std::pair<unsigned_int,_long>_>_>
              ::~vector((vector<std::pair<unsigned_int,_long>,_std::allocator<std::pair<unsigned_int,_long>_>_>
                         *)&__begin2_1);
              bVar1 = TrainerSpec::use_all_vocab((TrainerSpec *)(in_RSI + 0xe));
              if (bVar1) {
                sVar6 = std::
                        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
                        ::size((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float>_>_>
                                *)(in_RSI + 8));
                sVar5 = std::
                        map<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::ModelProto_SentencePiece_Type>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::ModelProto_SentencePiece_Type>_>_>_>
                        ::size((map<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::ModelProto_SentencePiece_Type>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sentencepiece::ModelProto_SentencePiece_Type>_>_>_>
                                *)(in_RSI + 0x4c));
                TrainerSpec::set_vocab_size((TrainerSpec *)(in_RSI + 0xe),(int)sVar6 + (int)sVar5);
              }
              TrainerInterface::Save(&this->super_TrainerInterface);
            }
            else {
              util::StatusBuilder::StatusBuilder(&local_680,kInternal);
              pSVar4 = util::StatusBuilder::operator<<
                                 (&local_680,(char (*) [26])"src/char_model_trainer.cc");
              pSVar4 = util::StatusBuilder::operator<<(pSVar4,(char (*) [2])0x3a86b0);
              __range2_1._4_4_ = 0x2a;
              pSVar4 = util::StatusBuilder::operator<<(pSVar4,(int *)((long)&__range2_1 + 4));
              pSVar4 = util::StatusBuilder::operator<<(pSVar4,(char (*) [4])") [");
              pSVar4 = util::StatusBuilder::operator<<
                                 (pSVar4,(char (*) [22])"final_pieces_.empty()");
              util::StatusBuilder::operator<<(pSVar4,(char (*) [3])"] ");
              util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this);
              util::StatusBuilder::~StatusBuilder(&local_680);
            }
          }
        }
      }
      else {
        util::StatusBuilder::StatusBuilder(&local_338,kInternal);
        pSVar4 = util::StatusBuilder::operator<<
                           (&local_338,(char (*) [26])"src/char_model_trainer.cc");
        pSVar4 = util::StatusBuilder::operator<<(pSVar4,(char (*) [2])0x3a86b0);
        vocab_size = 0x1c;
        pSVar4 = util::StatusBuilder::operator<<(pSVar4,&vocab_size);
        pSVar4 = util::StatusBuilder::operator<<(pSVar4,(char (*) [4])") [");
        pSVar4 = util::StatusBuilder::operator<<
                           (pSVar4,(char (*) [52])
                                   "(TrainerSpec::CHAR) == (trainer_spec_.model_type())");
        util::StatusBuilder::operator<<(pSVar4,(char (*) [3])"] ");
        util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this);
        util::StatusBuilder::~StatusBuilder(&local_338);
      }
    }
    else {
      util::StatusBuilder::StatusBuilder(&local_1b0,kInternal);
      pSVar4 = util::StatusBuilder::operator<<
                         (&local_1b0,(char (*) [26])"src/char_model_trainer.cc");
      pSVar4 = util::StatusBuilder::operator<<(pSVar4,(char (*) [2])0x3a86b0);
      local_1b4 = 0x1b;
      pSVar4 = util::StatusBuilder::operator<<(pSVar4,&local_1b4);
      pSVar4 = util::StatusBuilder::operator<<(pSVar4,(char (*) [4])") [");
      pSVar4 = util::StatusBuilder::operator<<
                         (pSVar4,(char (*) [38])"normalizer_spec_.escape_whitespaces()");
      util::StatusBuilder::operator<<(pSVar4,(char (*) [3])"] ");
      util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this);
      util::StatusBuilder::~StatusBuilder(&local_1b0);
    }
  }
  return this;
}

Assistant:

util::Status Trainer::Train() {
  RETURN_IF_ERROR(status());

  CHECK_OR_RETURN(normalizer_spec_.escape_whitespaces());
  CHECK_EQ_OR_RETURN(TrainerSpec::CHAR, trainer_spec_.model_type());

  RETURN_IF_ERROR(LoadSentences());

  const int vocab_size = trainer_spec_.vocab_size() - meta_pieces_.size();
  CHECK_GE_OR_RETURN(vocab_size, 0);

  uint64 sum = 0;
  for (const auto &it : required_chars_) {
    sum += it.second;
  }

  const auto logsum = std::log(static_cast<float>(sum));

  CHECK_OR_RETURN(final_pieces_.empty());
  for (const auto &it : Sorted(required_chars_)) {
    if (!trainer_spec_.use_all_vocab() &&
        final_pieces_.size() == static_cast<size_t>(vocab_size)) {
      break;
    }
    final_pieces_.emplace_back(
        string_util::UnicodeCharToUTF8(it.first),
        std::log(static_cast<float>(it.second)) - logsum);
  }

  if (trainer_spec_.use_all_vocab()) {
    trainer_spec_.set_vocab_size(final_pieces_.size() + meta_pieces_.size());
  }

  return Save();
}